

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
bas::Vector<bool,4ul,bas::RawAllocator>::init_copy_from_other_vector<4ul>
          (Vector<bool,4ul,bas::RawAllocator> *this,Vector<bool,_4UL,_bas::RawAllocator> *other)

{
  size_t size_00;
  bool *pbVar1;
  void *pvVar2;
  bool *__last;
  size_t local_28;
  size_t capacity;
  size_t size;
  Vector<bool,_4UL,_bas::RawAllocator> *other_local;
  Vector<bool,_4UL,_bas::RawAllocator> *this_local;
  
  size_00 = Vector<bool,_4UL,_bas::RawAllocator>::size(other);
  if (size_00 < 5) {
    pbVar1 = Vector<bool,_4UL,_bas::RawAllocator>::small_buffer
                       ((Vector<bool,_4UL,_bas::RawAllocator> *)this);
    *(bool **)this = pbVar1;
    local_28 = 4;
  }
  else {
    pvVar2 = RawAllocator::allocate((RawAllocator *)(this + 0x18),size_00,1);
    *(void **)this = pvVar2;
    local_28 = size_00;
  }
  *(size_t *)(this + 8) = *(long *)this + size_00;
  *(size_t *)(this + 0x10) = *(long *)this + local_28;
  pbVar1 = Vector<bool,_4UL,_bas::RawAllocator>::begin(other);
  __last = Vector<bool,_4UL,_bas::RawAllocator>::end(other);
  std::uninitialized_copy<bool_const*,bool*>(pbVar1,__last,*(bool **)this);
  *(long *)(this + 0x20) = *(long *)(this + 8) - *(long *)this;
  return;
}

Assistant:

void init_copy_from_other_vector(const Vector<T, OtherN, Allocator> &other)
    {
        m_allocator = other.m_allocator;

        size_t size = other.size();
        size_t capacity = size;

        if (size <= N) {
            m_begin = this->small_buffer();
            capacity = N;
        }
        else {
            m_begin = (T *)m_allocator.allocate(sizeof(T) * size,
                                                std::alignment_of<T>::value);
            capacity = size;
        }

        m_end = m_begin + size;
        m_capacity_end = m_begin + capacity;

        uninitialized_copy(other.begin(), other.end(), m_begin);
        UPDATE_VECTOR_SIZE(this);
    }